

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O2

void Kit_TruthCofactor0(uint *pTruth,int nVars,int iVar)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar2 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar2 = 1;
  }
  if (iVar < nVars) {
    switch(iVar) {
    case 0:
      uVar8 = 0;
      uVar7 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar7 = uVar8;
      }
      for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        pTruth[uVar8] = (pTruth[uVar8] & 0x55555555) * 3;
      }
      break;
    case 1:
      uVar8 = 0;
      uVar7 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar7 = uVar8;
      }
      for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        pTruth[uVar8] = (pTruth[uVar8] & 0x33333333) * 5;
      }
      break;
    case 2:
      uVar8 = 0;
      uVar7 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar7 = uVar8;
      }
      for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        pTruth[uVar8] = (pTruth[uVar8] & 0xf0f0f0f) * 0x11;
      }
      break;
    case 3:
      uVar8 = 0;
      uVar7 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar7 = uVar8;
      }
      for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        pTruth[uVar8] = (pTruth[uVar8] & 0xff00ff) * 0x101;
      }
      break;
    case 4:
      uVar8 = 0;
      uVar7 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar7 = uVar8;
      }
      for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        pTruth[uVar8] = (uint)(ushort)pTruth[uVar8] * 0x10001;
      }
      break;
    default:
      bVar3 = (char)iVar - 5;
      bVar1 = bVar3 & 0x1f;
      uVar5 = 1 << bVar1;
      iVar4 = 2 << (bVar3 & 0x1f);
      iVar6 = 0 << bVar1;
      uVar7 = 0;
      if (0 < (int)uVar5) {
        uVar7 = (ulong)uVar5;
      }
      for (; iVar6 < (int)uVar2; iVar6 = iVar6 + iVar4) {
        for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
          pTruth[(long)(int)uVar5 + uVar8] = pTruth[uVar8];
        }
        pTruth = pTruth + iVar4;
      }
    }
    return;
  }
  __assert_fail("iVar < nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitTruth.c"
                ,0x175,"void Kit_TruthCofactor0(unsigned int *, int, int)");
}

Assistant:

void Kit_TruthCofactor0( unsigned * pTruth, int nVars, int iVar )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Step;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = (pTruth[i] & 0x55555555) | ((pTruth[i] & 0x55555555) << 1);
        return;
    case 1:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = (pTruth[i] & 0x33333333) | ((pTruth[i] & 0x33333333) << 2);
        return;
    case 2:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = (pTruth[i] & 0x0F0F0F0F) | ((pTruth[i] & 0x0F0F0F0F) << 4);
        return;
    case 3:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = (pTruth[i] & 0x00FF00FF) | ((pTruth[i] & 0x00FF00FF) << 8);
        return;
    case 4:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = (pTruth[i] & 0x0000FFFF) | ((pTruth[i] & 0x0000FFFF) << 16);
        return;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
                pTruth[Step+i] = pTruth[i];
            pTruth += 2*Step;
        }
        return;
    }
}